

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeIntError
DivisionHelper<unsigned_long,_short,_1>::Divide(unsigned_long *t,short *u,unsigned_long *result)

{
  ushort t_00;
  uint32_t uVar1;
  ulong uVar2;
  
  t_00 = *u;
  if ((ulong)t_00 == 0) {
    return SafeIntDivideByZero;
  }
  if (*t != 0) {
    if (0 < (short)t_00) {
      uVar2 = *t / (ulong)t_00;
      goto LAB_0014db71;
    }
    uVar1 = AbsValueHelper<short,_0>::Abs(t_00);
    if ((ulong)uVar1 <= *t) {
      return SafeIntArithmeticOverflow;
    }
  }
  uVar2 = 0;
LAB_0014db71:
  *result = uVar2;
  return SafeIntNoError;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {

        if( u == 0 )
            return SafeIntDivideByZero;

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return SafeIntNoError;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return SafeIntNoError;
        }

        return SafeIntArithmeticOverflow;
    }